

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O3

int osnet_connect_webui(char *addr,int port,char *path,char **errmsg)

{
  printf("\nconnectWebUI:http://%s:%d%s\n",addr,port,path);
  fflush(_stdout);
  *errmsg = (char *)0x0;
  return 1;
}

Assistant:

int osnet_connect_webui(VMG_ const char *addr, int port, const char *path,
                        char **errmsg)
{
    /* 
     *   Web server mode: our parent process is the conventional Web server
     *   running the php launch page.  The php launch page has a pipe
     *   connection to our stdout.  Send the start page information back to
     *   the php page simply by writing the information to stdout.  
     */
    printf("\nconnectWebUI:http://%s:%d%s\n", addr, port, path);
    fflush(stdout);

    /* success */
    *errmsg = 0;
    return TRUE;
}